

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cpp
# Opt level: O2

bool wallet::operator<(BytePrefix a,Span<const_std::byte> b)

{
  bool bVar1;
  long in_FS_OFFSET;
  byte *local_28;
  ulong local_20;
  byte *local_18;
  ulong local_10;
  long local_8;
  
  local_10 = a.prefix.m_size;
  local_18 = a.prefix.m_data;
  local_28 = b.m_data;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = local_10;
  if (b.m_size < local_10) {
    local_20 = b.m_size;
  }
  bVar1 = std::ranges::__lexicographical_compare_fn::
          operator()<Span<const_std::byte>_&,_Span<const_std::byte>,_std::identity,_std::identity,_std::ranges::less>
                    ((__lexicographical_compare_fn *)&std::ranges::lexicographical_compare,&local_18
                     ,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool operator<(BytePrefix a, Span<const std::byte> b) { return std::ranges::lexicographical_compare(a.prefix, b.subspan(0, std::min(a.prefix.size(), b.size()))); }